

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

char goodform::json::parse_escaped_char(char input)

{
  char local_a;
  char returnVal;
  char input_local;
  
  local_a = input;
  if (((input != '\\') && (input != '/')) && (input != '\"')) {
    if (input == 'b') {
      local_a = '\b';
    }
    else if (input == 'f') {
      local_a = '\f';
    }
    else if (input == 'n') {
      local_a = '\n';
    }
    else if (input == 'r') {
      local_a = '\r';
    }
    else if (input == 't') {
      local_a = '\t';
    }
  }
  return local_a;
}

Assistant:

char json::parse_escaped_char(char input)
  {
    char returnVal = -1;
    if (input == '\\')
      returnVal = input;
    else if (input == '/')
      returnVal = input;
    else if (input == '"')
      returnVal = input;
    else if (input == 'b')
      returnVal = '\b';
    else if (input == 'f')
      returnVal = '\f';
    else if (input == 'n')
      returnVal = '\n';
    else if (input == 'r')
      returnVal = '\r';
    else if (input == 't')
      returnVal = '\t';
    else
      returnVal = input;
    return returnVal;
  }